

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O2

UBool ucm_checkValidity(UCMTable *table,UCMStates *baseStates)

{
  int iVar1;
  UCMapping *pUVar2;
  int32_t iVar3;
  UBool UVar4;
  anon_union_4_2_095b93d3_for_b *bytes;
  anon_union_4_2_095b93d3_for_b *paVar5;
  
  pUVar2 = table->mappings;
  iVar1 = table->mappingsLength;
  UVar4 = '\x01';
  for (paVar5 = &pUVar2->b; (UCMapping *)(paVar5 + -1) < pUVar2 + iVar1; paVar5 = paVar5 + 3) {
    bytes = paVar5;
    if (4 < *(int8_t *)((long)paVar5 + 5)) {
      bytes = (anon_union_4_2_095b93d3_for_b *)(table->bytes + paVar5->idx);
    }
    iVar3 = ucm_countChars(baseStates,bytes->bytes,(int)*(int8_t *)((long)paVar5 + 5));
    if (iVar3 < 1) {
      ucm_printMapping(table,(UCMapping *)(paVar5 + -1),_stderr);
      UVar4 = '\0';
    }
  }
  return UVar4;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucm_checkValidity(UCMTable *table, UCMStates *baseStates) {
    UCMapping *m, *mLimit;
    int32_t count;
    UBool isOK;

    m=table->mappings;
    mLimit=m+table->mappingsLength;
    isOK=TRUE;

    while(m<mLimit) {
        count=ucm_countChars(baseStates, UCM_GET_BYTES(table, m), m->bLen);
        if(count<1) {
            ucm_printMapping(table, m, stderr);
            isOK=FALSE;
        }
        ++m;
    }

    return isOK;
}